

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathway.c
# Opt level: O1

pathway_directions_t parse_pathway_directions(char *value)

{
  int iVar1;
  pathway_directions_t pVar2;
  
  iVar1 = strcmp(value,"0");
  if (iVar1 == 0) {
    pVar2 = PD_UNIDIRECTIONAL;
  }
  else {
    iVar1 = strcmp(value,"1");
    pVar2 = PD_NOT_SET - (iVar1 == 0);
  }
  return pVar2;
}

Assistant:

pathway_directions_t parse_pathway_directions(const char *value) {
    if (strcmp(value, "0") == 0)
        return PD_UNIDIRECTIONAL;
    else if (strcmp(value, "1") == 0)
        return PD_BIDIRECTIONAL;
    else
        return PD_NOT_SET;
}